

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter_terminal.cpp
# Opt level: O0

terminal_output_type __thiscall
E64::blitter_ic::terminal_check_output(blitter_ic *this,uint8_t no,bool top_down,uint32_t *address)

{
  int iVar1;
  uint8_t uVar2;
  byte bVar3;
  uint16_t uVar4;
  byte in_DL;
  byte in_SIL;
  blitter_ic *in_RDI;
  int j_1;
  char potential_address_1 [7];
  int j;
  char potential_address [7];
  int i;
  terminal_output_type output;
  int local_38;
  uint8_t auStack_33 [6];
  undefined1 local_2d;
  int local_2c;
  uint8_t auStack_27 [6];
  undefined1 local_21;
  int local_20;
  terminal_output_type local_1c;
  byte local_a;
  byte local_9;
  
  local_a = in_DL & 1;
  local_1c = NOTHING;
  local_20 = 0;
  local_9 = in_SIL;
  do {
    iVar1 = local_20;
    uVar4 = blit_t::get_tiles(in_RDI->blit + local_9);
    if ((int)(uint)uVar4 <= iVar1) {
      return local_1c;
    }
    uVar2 = terminal_get_tile(in_RDI,local_9,(uint16_t)local_20);
    if (uVar2 == ':') {
      local_1c = ASCII;
      for (local_2c = 0; local_2c < 6; local_2c = local_2c + 1) {
        uVar2 = terminal_get_tile(in_RDI,local_9,(short)local_20 + 1 + (short)local_2c);
        auStack_27[local_2c] = uVar2;
      }
      local_21 = 0;
joined_r0x001274dd:
      if ((local_a & 1) != 0) {
        return local_1c;
      }
    }
    else {
      uVar2 = terminal_get_tile(in_RDI,local_9,(uint16_t)local_20);
      if (uVar2 == ';') {
        local_1c = MONITOR_WORD;
        for (local_38 = 0; local_38 < 6; local_38 = local_38 + 1) {
          uVar2 = terminal_get_tile(in_RDI,local_9,(short)local_20 + 1 + (short)local_38);
          auStack_33[local_38] = uVar2;
        }
        local_2d = 0;
        goto joined_r0x001274dd;
      }
    }
    bVar3 = blit_t::get_columns(in_RDI->blit + local_9);
    local_20 = (uint)bVar3 + local_20;
  } while( true );
}

Assistant:

enum E64::terminal_output_type E64::blitter_ic::terminal_check_output(uint8_t no, bool top_down, uint32_t *address)
{
	enum terminal_output_type output = NOTHING;

	for (int i = 0; i < blit[no].get_tiles(); i += blit[no].get_columns()) {
		if (terminal_get_tile(no, i) == ':') {
			output = ASCII;
			char potential_address[7];
			for (int j=0; j<6; j++) {
				potential_address[j] = terminal_get_tile(no, i+1+j);
			}
			potential_address[6] = 0;
			//hud.hex_string_to_int(potential_address, address);
			if (top_down) break;
		} else if (terminal_get_tile(no, i) == ';') {
			output = MONITOR_WORD;
			char potential_address[7];
			for (int j=0; j<6; j++) {
				potential_address[j] = terminal_get_tile(no, i+1+j);
			}
			potential_address[6] = 0;
			//hud.hex_string_to_int(potential_address, address);
			if (top_down) break;
		}
	}
	return output;
}